

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::base64_urlencode::operator()(base64_urlencode *this,ostream *out)

{
  ostream *out_00;
  steal_buffer<128UL> *this_00;
  ostream *in_RDI;
  uchar *end;
  uchar *begin;
  steal_buffer<128UL> sb;
  ostream *in_stack_fffffffffffffed8;
  steal_buffer<128UL> *in_stack_fffffffffffffee0;
  steal_buffer<128UL> *in_stack_fffffffffffffef0;
  
  util::steal_buffer<128UL>::steal_buffer(in_stack_fffffffffffffef0,in_RDI);
  streamable::operator()((streamable *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  util::steal_buffer<128UL>::release(in_stack_fffffffffffffee0);
  out_00 = (ostream *)util::stackbuf<128UL>::begin((stackbuf<128UL> *)0x40c3e0);
  this_00 = (steal_buffer<128UL> *)util::stackbuf<128UL>::end((stackbuf<128UL> *)0x40c3fb);
  b64url::encode((uchar *)this_00,(uchar *)in_RDI,out_00);
  util::steal_buffer<128UL>::~steal_buffer(this_00);
  return;
}

Assistant:

void base64_urlencode::operator()(std::ostream &out) const
	{
		util::steal_buffer<> sb(out);
		obj_(out);
		sb.release();
		using namespace cppcms::b64url;
		unsigned char const *begin=reinterpret_cast<unsigned char const *>(sb.begin());
		unsigned char const *end=  reinterpret_cast<unsigned char const *>(sb.end());
		b64url::encode(begin,end,out);
	}